

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefValue.cpp
# Opt level: O1

int BeliefValue::GetMaximizingVectorIndex(BeliefInterface *b,VectorSet *v)

{
  double dVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  vector<double,_std::allocator<double>_> Vb;
  void *local_28 [2];
  long local_18;
  
  uVar5 = (ulong)(uint)v->size1_;
  (*b->_vptr_BeliefInterface[0x11])(local_28,b);
  if (uVar5 == 0) {
    iVar3 = 0;
  }
  else {
    uVar2 = 0;
    auVar6 = ZEXT816(0xffefffffffffffff);
    uVar4 = 0;
    do {
      dVar1 = *(double *)((long)local_28[0] + uVar2 * 8);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = dVar1;
      if (auVar6._0_8_ < dVar1) {
        uVar4 = uVar2 & 0xffffffff;
      }
      iVar3 = (int)uVar4;
      auVar6 = vmaxsd_avx(auVar7,auVar6);
      uVar2 = uVar2 + 1;
    } while (uVar5 != uVar2);
  }
  if (local_28[0] != (void *)0x0) {
    operator_delete(local_28[0],local_18 - (long)local_28[0]);
  }
  return iVar3;
}

Assistant:

int
BeliefValue::GetMaximizingVectorIndex(const BeliefInterface &b, 
                                      const VectorSet &v)
{
    int nrInV=v.size1();
    int maximizingVectorI=0;
    double maxVal;

    // compute value of b for every vector in VS
    vector<double> Vb=b.InnerProduct(v);

    // find maximizing vector, ignores effects of duplicate values
    maxVal=-DBL_MAX;
    for(int k=0;k!=nrInV;k++)
    {
        if(Vb[k]>maxVal)
        {
            maxVal=Vb[k];
            maximizingVectorI=k;
        }
    }

    return(maximizingVectorI);
}